

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  LexChar LVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  int iVar4;
  SQInteger SVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  SQUnsignedInteger SVar9;
  SQUnsignedInteger SVar10;
  SQChar *sTemp;
  char local_39 [9];
  
  LVar1 = this->_currdata;
  local_39[0] = '\0';
  sqvector<char>::resize(&this->_longstr,0,local_39);
  SVar5 = (*this->_readf)(this->_up);
  if (0xff < SVar5) {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  if (SVar5 == 0) {
    this->_currdata = '\0';
    this->_reached_eof = 1;
  }
  else {
    this->_currdata = (LexChar)SVar5;
  }
  this->_currentcolumn = this->_currentcolumn + 1;
  if (LVar1 == '0') {
    bVar7 = this->_currdata;
    iVar4 = toupper((uint)bVar7);
    bVar7 = bVar7 & 0xf8;
    if (iVar4 == 0x58 || bVar7 == 0x30) {
      if (bVar7 == 0x30) {
        bVar7 = this->_currdata;
        while ((bVar7 & 0xf8) == 0x30) {
          uVar2 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar2) {
            SVar10 = uVar2 * 2;
            if (SVar10 == 0) {
              SVar10 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar10);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = SVar10;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = bVar7;
          SVar5 = (*this->_readf)(this->_up);
          if (0xff < SVar5) {
            (*this->_errfunc)(this->_errtarget,"Invalid character");
          }
          if (SVar5 == 0) {
            this->_currdata = '\0';
            this->_reached_eof = 1;
          }
          else {
            this->_currdata = (LexChar)SVar5;
          }
          this->_currentcolumn = this->_currentcolumn + 1;
          bVar7 = this->_currdata;
        }
        lVar8 = 5;
        if (9 < bVar7 - 0x30) goto LAB_00124a0a;
        pcVar6 = "invalid octal number";
      }
      else {
        SVar5 = (*this->_readf)(this->_up);
        if (0xff < SVar5) {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        if (SVar5 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
        }
        else {
          this->_currdata = (LexChar)SVar5;
        }
        this->_currentcolumn = this->_currentcolumn + 1;
        bVar7 = this->_currdata;
        iVar4 = isxdigit((uint)bVar7);
        while (iVar4 != 0) {
          uVar2 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar2) {
            SVar10 = uVar2 * 2;
            if (SVar10 == 0) {
              SVar10 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar10);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = SVar10;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = bVar7;
          SVar5 = (*this->_readf)(this->_up);
          if (0xff < SVar5) {
            (*this->_errfunc)(this->_errtarget,"Invalid character");
          }
          if (SVar5 == 0) {
            this->_currdata = '\0';
            this->_reached_eof = 1;
          }
          else {
            this->_currdata = (LexChar)SVar5;
          }
          this->_currentcolumn = this->_currentcolumn + 1;
          bVar7 = this->_currdata;
          iVar4 = isxdigit((uint)bVar7);
        }
        lVar8 = 3;
        if ((this->_longstr)._size < 0x11) goto LAB_00124a0a;
        pcVar6 = "too many digits for an Hex number";
      }
      (*this->_errfunc)(this->_errtarget,pcVar6);
      goto LAB_00124a0a;
    }
  }
  uVar2 = (this->_longstr)._size;
  SVar3 = (this->_longstr)._allocated;
  if (SVar3 <= uVar2) {
    SVar10 = uVar2 * 2;
    SVar9 = 4;
    if (SVar10 != 0) {
      SVar9 = SVar10;
    }
    pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar9);
    (this->_longstr)._vals = pcVar6;
    (this->_longstr)._allocated = SVar9;
  }
  SVar3 = (this->_longstr)._size;
  (this->_longstr)._size = SVar3 + 1;
  (this->_longstr)._vals[SVar3] = LVar1;
  lVar8 = 1;
  while ((bVar7 = this->_currdata, bVar7 - 0x30 < 10 ||
         ((bVar7 - 0x2e < 0x38 && ((0x80000000800001U >> ((ulong)(bVar7 - 0x2e) & 0x3f) & 1) != 0)))
         )) {
    if ((bVar7 & 0xdf) == 0x45) {
      lVar8 = 2;
    }
    if (bVar7 == 0x2e) {
      lVar8 = 2;
    }
    if ((bVar7 & 0xdf) == 0x45) {
      if (lVar8 != 2) {
        (*this->_errfunc)(this->_errtarget,"invalid numeric format");
      }
      LVar1 = this->_currdata;
      SVar3 = (this->_longstr)._allocated;
      uVar2 = (this->_longstr)._size;
      if (SVar3 <= uVar2) {
        SVar10 = uVar2 * 2;
        if (SVar10 == 0) {
          SVar10 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar10);
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = SVar10;
      }
      SVar3 = (this->_longstr)._size;
      (this->_longstr)._size = SVar3 + 1;
      (this->_longstr)._vals[SVar3] = LVar1;
      SVar5 = (*this->_readf)(this->_up);
      if (0xff < SVar5) {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      if (SVar5 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        this->_currdata = (LexChar)SVar5;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      LVar1 = this->_currdata;
      if ((LVar1 == '-') || (LVar1 == '+')) {
        uVar2 = (this->_longstr)._size;
        SVar3 = (this->_longstr)._allocated;
        if (SVar3 <= uVar2) {
          SVar10 = uVar2 * 2;
          if (SVar10 == 0) {
            SVar10 = 4;
          }
          pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar10);
          (this->_longstr)._vals = pcVar6;
          (this->_longstr)._allocated = SVar10;
        }
        SVar3 = (this->_longstr)._size;
        (this->_longstr)._size = SVar3 + 1;
        (this->_longstr)._vals[SVar3] = LVar1;
        SVar5 = (*this->_readf)(this->_up);
        if (0xff < SVar5) {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        if (SVar5 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
        }
        else {
          this->_currdata = (LexChar)SVar5;
        }
        this->_currentcolumn = this->_currentcolumn + 1;
      }
      lVar8 = 4;
      if (9 < this->_currdata - 0x30) {
        (*this->_errfunc)(this->_errtarget,"exponent expected");
      }
    }
    LVar1 = this->_currdata;
    SVar3 = (this->_longstr)._allocated;
    uVar2 = (this->_longstr)._size;
    if (SVar3 <= uVar2) {
      SVar10 = uVar2 * 2;
      if (SVar10 == 0) {
        SVar10 = 4;
      }
      pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar10);
      (this->_longstr)._vals = pcVar6;
      (this->_longstr)._allocated = SVar10;
    }
    SVar3 = (this->_longstr)._size;
    (this->_longstr)._size = SVar3 + 1;
    (this->_longstr)._vals[SVar3] = LVar1;
    SVar5 = (*this->_readf)(this->_up);
    if (0xff < SVar5) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar5 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar5;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
  }
LAB_00124a0a:
  uVar2 = (this->_longstr)._size;
  SVar3 = (this->_longstr)._allocated;
  if (SVar3 <= uVar2) {
    SVar10 = uVar2 * 2;
    SVar9 = 4;
    if (SVar10 != 0) {
      SVar9 = SVar10;
    }
    pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar9);
    (this->_longstr)._vals = pcVar6;
    (this->_longstr)._allocated = SVar9;
  }
  SVar3 = (this->_longstr)._size;
  (this->_longstr)._size = SVar3 + 1;
  (this->_longstr)._vals[SVar3] = '\0';
  SVar5 = (*(code *)(&DAT_001355c0 + *(int *)(&DAT_001355c0 + (lVar8 + -1) * 4)))();
  return SVar5;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4
#define TOCTAL 5
    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    INIT_TEMP_STRING();
    NEXT();
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X') || scisodigit(CUR_CHAR)) ) {
        if(scisodigit(CUR_CHAR)) {
            type = TOCTAL;
            while(scisodigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(scisdigit(CUR_CHAR)) Error(_SC("invalid octal number"));
        }
        else {
            NEXT();
            type = THEX;
            while(isxdigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(_longstr.size() > MAX_HEX_DIGITS) Error(_SC("too many digits for an Hex number"));
        }
    }
    else {
        APPEND_CHAR((int)firstchar);
        while (CUR_CHAR == _SC('.') || scisdigit(CUR_CHAR) || isexponent(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.') || isexponent(CUR_CHAR)) type = TFLOAT;
            if(isexponent(CUR_CHAR)) {
                if(type != TFLOAT) Error(_SC("invalid numeric format"));
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!scisdigit(CUR_CHAR)) Error(_SC("exponent expected"));
            }

            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
        _fvalue = (SQFloat)scstrtod(&_longstr[0],&sTemp);
        return TK_FLOAT;
    case TINT:
        LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case TOCTAL:
        LexOctal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}